

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int __thiscall fmt::v6::internal::bigint::divmod_assign(bigint *this,bigint *divisor)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  
  iVar2 = compare(this,divisor);
  if (iVar2 < 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = this->exp_ - divisor->exp_;
    if (iVar2 != 0 && divisor->exp_ <= this->exp_) {
      uVar3 = (uint)(this->bigits_).super_buffer<unsigned_int>.size_;
      buffer<unsigned_int>::resize((buffer<unsigned_int> *)this,(ulong)(iVar2 + uVar3));
      puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      puVar5 = puVar1 + (int)(uVar3 + iVar2 + -1);
      while (uVar3 = uVar3 - 1, -1 < (int)uVar3) {
        *puVar5 = puVar1[uVar3];
        puVar5 = puVar5 + -1;
      }
      std::__fill_n_a<unsigned_int*,int,int>(puVar1,iVar2);
      this->exp_ = this->exp_ - iVar2;
    }
    iVar2 = 0;
    do {
      subtract_aligned(this,divisor);
      iVar2 = iVar2 + 1;
      iVar4 = compare(this,divisor);
    } while (-1 < iVar4);
  }
  return iVar2;
}

Assistant:

int divmod_assign(const bigint& divisor) {
    FMT_ASSERT(this != &divisor, "");
    if (compare(*this, divisor) < 0) return 0;
    int num_bigits = static_cast<int>(bigits_.size());
    FMT_ASSERT(divisor.bigits_[divisor.bigits_.size() - 1u] != 0, "");
    int exp_difference = exp_ - divisor.exp_;
    if (exp_difference > 0) {
      // Align bigints by adding trailing zeros to simplify subtraction.
      bigits_.resize(to_unsigned(num_bigits + exp_difference));
      for (int i = num_bigits - 1, j = i + exp_difference; i >= 0; --i, --j)
        bigits_[j] = bigits_[i];
      std::uninitialized_fill_n(bigits_.data(), exp_difference, 0);
      exp_ -= exp_difference;
    }
    int quotient = 0;
    do {
      subtract_aligned(divisor);
      ++quotient;
    } while (compare(*this, divisor) >= 0);
    return quotient;
  }